

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsd_filters.cpp
# Opt level: O3

short __thiscall DSDcc::DSDFilters::dmr_filter(DSDFilters *this,short sample)

{
  long lVar1;
  float *v;
  undefined6 in_register_00000032;
  float fVar2;
  
  memmove(this,this->xv + 1,0xf0);
  this->xv[0x3c] = (float)(int)CONCAT62(in_register_00000032,sample);
  fVar2 = 0.0;
  lVar1 = 0;
  do {
    fVar2 = fVar2 + this->xv[lVar1] * (float)(&dmrcoeffs)[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x3d);
  return (short)(int)(fVar2 * 0.14641866);
}

Assistant:

short DSDFilters::dmr_filter(short sample) // all 4800 baud filters for now
{
    return dsd_input_filter(sample, 3);
}